

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_font * rf_ttf_font_from_atlas
                    (rf_font *__return_storage_ptr__,int font_size,rf_image atlas,
                    rf_glyph_info *glyph_metrics,rf_int glyphs_count)

{
  rf_image image;
  undefined8 in_stack_ffffffffffffff70;
  int local_70;
  undefined8 local_6c;
  undefined1 local_64 [36];
  undefined1 local_40;
  undefined8 local_38;
  rf_texture2d texture;
  rf_int glyphs_count_local;
  rf_glyph_info *glyph_metrics_local;
  int font_size_local;
  
  texture._16_8_ = glyphs_count;
  memset(__return_storage_ptr__,0,0x38);
  image.format = (int)in_stack_ffffffffffffff70;
  image.valid = (_Bool)(char)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  image._21_3_ = (int3)((ulong)in_stack_ffffffffffffff70 >> 0x28);
  image._0_16_ = atlas._8_16_;
  rf_load_texture_from_image(image);
  if ((texture.mipmaps & 1U) != 0) {
    local_6c = local_38;
    local_64._0_4_ = texture.id;
    local_64._4_4_ = texture.width;
    local_64._28_4_ = texture.format;
    local_64[0x20] = texture.valid;
    local_64._33_3_ = texture._21_3_;
    local_40 = 1;
    local_70 = font_size;
    local_64._20_8_ = glyph_metrics;
    memcpy(__return_storage_ptr__,&local_70,0x38);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_font rf_ttf_font_from_atlas(int font_size, rf_image atlas, rf_glyph_info* glyph_metrics, rf_int glyphs_count)
{
    rf_font result = {0};

    rf_texture2d texture = rf_load_texture_from_image(atlas);

    if (texture.valid)
    {
        result = (rf_font)
        {
            .glyphs = glyph_metrics,
            .glyphs_count = glyphs_count,
            .texture = texture,
            .base_size = font_size,
            .valid = true,
        };
    }

    return result;
}